

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

CURLcode cr_mime_resume_from(Curl_easy *data,Curl_creader *reader,curl_off_t offset)

{
  void *pvVar1;
  size_t sVar2;
  size_t local_1050;
  size_t nread;
  size_t readthisamountnow;
  char scratch [4096];
  curl_off_t passed;
  cr_mime_ctx *ctx;
  curl_off_t offset_local;
  Curl_creader *reader_local;
  Curl_easy *data_local;
  
  pvVar1 = reader->ctx;
  if (0 < offset) {
    scratch[0xff8] = '\0';
    scratch[0xff9] = '\0';
    scratch[0xffa] = '\0';
    scratch[0xffb] = '\0';
    scratch[0xffc] = '\0';
    scratch[0xffd] = '\0';
    scratch[0xffe] = '\0';
    scratch[0xfff] = '\0';
    do {
      if (offset - scratch._4088_8_ < 0x1001) {
        local_1050 = curlx_sotouz(offset - scratch._4088_8_);
      }
      else {
        local_1050 = 0x1000;
      }
      sVar2 = Curl_mime_read((char *)&readthisamountnow,1,local_1050,*(void **)((long)pvVar1 + 0x20)
                            );
      scratch._4088_8_ = sVar2 + scratch._4088_8_;
      if ((sVar2 == 0) || (local_1050 < sVar2)) {
        Curl_failf(data,"Could only read %ld bytes from the mime post",scratch._4088_8_);
        return CURLE_READ_ERROR;
      }
    } while ((long)scratch._4088_8_ < offset);
    if ((0 < *(long *)((long)pvVar1 + 0x28)) &&
       (*(long *)((long)pvVar1 + 0x28) = *(long *)((long)pvVar1 + 0x28) - offset,
       *(long *)((long)pvVar1 + 0x28) < 1)) {
      Curl_failf(data,"Mime post already completely uploaded");
      return CURLE_PARTIAL_FILE;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cr_mime_resume_from(struct Curl_easy *data,
                                    struct Curl_creader *reader,
                                    curl_off_t offset)
{
  struct cr_mime_ctx *ctx = reader->ctx;

  if(offset > 0) {
    curl_off_t passed = 0;

    do {
      char scratch[4*1024];
      size_t readthisamountnow =
        (offset - passed > (curl_off_t)sizeof(scratch)) ?
        sizeof(scratch) :
        curlx_sotouz(offset - passed);
      size_t nread;

      nread = Curl_mime_read(scratch, 1, readthisamountnow, ctx->part);
      passed += (curl_off_t)nread;
      if((nread == 0) || (nread > readthisamountnow)) {
        /* this checks for greater-than only to make sure that the
           CURL_READFUNC_ABORT return code still aborts */
        failf(data, "Could only read %" FMT_OFF_T
              " bytes from the mime post", passed);
        return CURLE_READ_ERROR;
      }
    } while(passed < offset);

    /* now, decrease the size of the read */
    if(ctx->total_len > 0) {
      ctx->total_len -= offset;

      if(ctx->total_len <= 0) {
        failf(data, "Mime post already completely uploaded");
        return CURLE_PARTIAL_FILE;
      }
    }
    /* we have passed, proceed as normal */
  }
  return CURLE_OK;
}